

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

stb_sdict * stb_sdict_copy(stb_sdict *old)

{
  void *pvVar1;
  void *p;
  stb_sdict *psVar2;
  
  pvVar1 = old->arena;
  if (pvVar1 == (void *)0x0) {
    p = (void *)0x0;
  }
  else {
    p = malloc_base((void *)0x0,1,STB__alloc,stb_alloc_alignment);
  }
  old->arena = p;
  psVar2 = stb_sdictinternal_copy(old);
  old->arena = pvVar1;
  if (psVar2 == (stb_sdict *)0x0) {
    if (p != (void *)0x0) {
      stb_free(p);
    }
  }
  else {
    psVar2->arena = p;
  }
  return psVar2;
}

Assistant:

stb_sdict* stb_sdict_copy(stb_sdict *old)
{
   stb_sdict *n;
   void *old_arena = old->arena;
   void *new_arena = old_arena ? stb_malloc_global(1) : NULL;
   old->arena = new_arena;
   n = stb_sdictinternal_copy(old);
   old->arena = old_arena;
   if (n)
      n->arena = new_arena;
   else if (new_arena)
      stb_free(new_arena);
   return n;
}